

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall DReachabilityPropagator::remove_deg1(DReachabilityPropagator *this,int u)

{
  pointer pvVar1;
  uint *puVar2;
  long lVar3;
  BoolView *pBVar4;
  bool bVar5;
  bool bVar6;
  Lit LVar7;
  uint uVar8;
  int iVar9;
  anon_union_8_2_743a5d44_for_Reason_0 aVar10;
  BoolView *pBVar11;
  ulong uVar12;
  undefined8 unaff_RBP;
  ulong uVar13;
  Lit *pLVar14;
  uint *puVar15;
  int u_local;
  int last_seen;
  undefined4 uStack_7c;
  vec<Lit> local_78;
  Clause *expl;
  Lit *pLStack_60;
  int oe;
  vec<Lit> local_48;
  uint local_34;
  
  uVar8 = (uint)unaff_RBP;
  pBVar11 = (this->super_GraphPropagator).vs.data;
  u_local = u;
  if (sat.assigns.data[(uint)pBVar11[(uint)u].v] != '\0') {
    bVar5 = BoolView::isFalse(pBVar11 + (uint)u);
    uVar13 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    uVar8 = (uint)uVar13;
    if (bVar5) goto LAB_001a53d8;
  }
  iVar9 = this->root;
  if (iVar9 == u) {
    if (1 < this->in_nodes_size) {
      _last_seen = (Clause *)CONCAT44(uStack_7c,0xffffffff);
      local_48.sz = 0;
      local_48.cap = 0;
      local_48.data = (Lit *)0x0;
      if (so.lazy == true) {
        vec<Lit>::push(&local_48);
        u = this->root;
      }
      pvVar1 = (this->ou).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)pvVar1[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      uVar13 = 0;
      for (puVar15 = *(uint **)&pvVar1[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data; puVar15 != puVar2; puVar15 = puVar15 + 1) {
        uVar8 = *puVar15;
        pBVar11 = (this->super_GraphPropagator).es.data;
        if ((sat.assigns.data[(uint)pBVar11[uVar8].v] == '\0') ||
           (bVar5 = BoolView::isTrue(pBVar11 + uVar8), bVar5)) {
          uVar13 = (ulong)((int)uVar13 + 1);
          _last_seen = (Clause *)CONCAT44(uStack_7c,uVar8);
        }
        else if (so.lazy == true) {
          LVar7 = BoolView::getValLit((this->super_GraphPropagator).es.data + uVar8);
          local_78.sz = LVar7.x;
          vec<Lit>::push(&local_48,(Lit *)&local_78);
        }
      }
      bVar5 = true;
      if (((int)uVar13 == 1) && (1 < this->in_nodes_size)) {
        uVar12 = (ulong)_last_seen & 0xffffffff;
        pBVar11 = (this->super_GraphPropagator).es.data;
        if (sat.assigns.data[(uint)pBVar11[uVar12].v] == '\0') {
          if (so.lazy == true) {
            uVar8 = get_some_innode_not(this,u_local);
            uVar13 = (ulong)uVar8;
            LVar7 = BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)this->root);
            local_78.sz = (uint)LVar7;
            vec<Lit>::push(&local_48,(Lit *)&local_78);
            local_78.sz = (uint)BoolView::getValLit((this->super_GraphPropagator).vs.data + uVar8);
            vec<Lit>::push(&local_48,(Lit *)&local_78);
            aVar10._pt = Reason_new<vec<Lit>>(&local_48);
            uVar12 = (ulong)_last_seen & 0xffffffff;
            pBVar11 = (this->super_GraphPropagator).es.data;
          }
          else {
            aVar10._pt = (Clause *)0x0;
          }
          BoolView::setVal(pBVar11 + uVar12,true,(Reason)aVar10);
          iVar9 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])(this);
          if ((char)iVar9 == '\0') {
LAB_001a50b7:
            bVar5 = false;
            uVar13 = 0;
          }
          else {
            Tint::operator=(this->last_state_e + last_seen,0);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->new_edge,&last_seen);
            pBVar11 = (this->super_GraphPropagator).vs.data;
            uVar12 = (ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[last_seen]
                                                .super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 4);
            if (sat.assigns.data[(uint)pBVar11[uVar12].v] == '\0') {
              if (so.lazy == true) {
                local_78.sz = 0;
                local_78.cap = 0;
                local_78.data = (Lit *)0x0;
                vec<Lit>::push(&local_78);
                LVar7 = BoolView::getValLit((this->super_GraphPropagator).es.data +
                                            ((ulong)_last_seen & 0xffffffff));
                expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
                vec<Lit>::push(&local_78,(Lit *)&expl);
                aVar10._pt = Reason_new<vec<Lit>>(&local_78);
                free(local_78.data);
                pBVar11 = (this->super_GraphPropagator).vs.data;
                uVar12 = (ulong)*(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [last_seen].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4);
              }
              BoolView::setVal(pBVar11 + uVar12,true,(Reason)aVar10);
              Tint::operator=(this->last_state_n +
                              *(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [last_seen].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 4),0);
              add_innode(this,*(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [last_seen].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 4));
              local_78.sz = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[last_seen]
                                                .super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 4);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&(this->new_node)._M_t,(int *)&local_78);
            }
            else {
              bVar5 = BoolView::isFalse(pBVar11 + uVar12);
              if (bVar5) {
                if (so.lazy == true) {
                  local_78.sz = 0;
                  local_78.cap = 0;
                  local_78.data = (Lit *)0x0;
                  LVar7 = BoolView::getValLit((this->super_GraphPropagator).es.data +
                                              ((ulong)_last_seen & 0xffffffff));
                  pLVar14 = (Lit *)&expl;
                  expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
                  vec<Lit>::push(&local_78,pLVar14);
                  expl = Clause_new<vec<Lit>>(&local_78,SUB81(pLVar14,0));
                  *(byte *)expl = *(byte *)expl | 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
                  sat.confl = expl;
                  free(local_78.data);
                }
                goto LAB_001a50b7;
              }
            }
            uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            bVar5 = false;
          }
        }
      }
      uVar8 = (uint)uVar13;
      free(local_48.data);
      if (!bVar5) goto LAB_001a53d8;
      iVar9 = this->root;
      u = u_local;
      goto LAB_001a4c6f;
    }
  }
  else {
LAB_001a4c6f:
    if (u != iVar9) {
      local_48.sz = 0;
      local_48.cap = 0;
      local_48.data = (Lit *)0x0;
      local_78.sz = 0;
      local_78.cap = 0;
      local_78.data = (Lit *)0x0;
      if (so.lazy == true) {
        vec<Lit>::push(&local_48);
        u = u_local;
      }
      pvVar1 = (this->in).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)pvVar1[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      iVar9 = 0;
      local_34 = uVar8;
      for (puVar15 = *(uint **)&pvVar1[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data; puVar15 != puVar2; puVar15 = puVar15 + 1) {
        uVar8 = *puVar15;
        pBVar11 = (this->super_GraphPropagator).es.data;
        if ((sat.assigns.data[(uint)pBVar11[uVar8].v] == '\0') ||
           (bVar5 = BoolView::isTrue(pBVar11 + uVar8), bVar5)) {
          iVar9 = iVar9 + 1;
        }
        else if (so.lazy == true) {
          LVar7 = BoolView::getValLit((this->super_GraphPropagator).es.data + uVar8);
          expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
          vec<Lit>::push(&local_48,(Lit *)&expl);
          LVar7 = BoolView::getValLit((this->super_GraphPropagator).es.data + uVar8);
          expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
          vec<Lit>::push(&local_78,(Lit *)&expl);
        }
      }
      if (iVar9 < 1) {
        uVar12 = (ulong)(uint)u_local;
        pBVar11 = (this->super_GraphPropagator).vs.data;
        if (sat.assigns.data[(uint)pBVar11[uVar12].v] == '\0') {
LAB_001a4f32:
          uVar13 = (ulong)local_34;
          bVar5 = true;
          if (sat.assigns.data[(uint)pBVar11[uVar12].v] == '\0') {
            if (so.lazy == true) {
              LVar7 = BoolView::getValLit(pBVar11 + (uint)this->root);
              expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
              vec<Lit>::push(&local_48,(Lit *)&expl);
              aVar10._pt = Reason_new<vec<Lit>>(&local_48);
              pBVar11 = (this->super_GraphPropagator).vs.data;
            }
            else {
              aVar10._pt = (Clause *)0x0;
            }
            BoolView::setVal(pBVar11 + (uint)u_local,false,(Reason)aVar10);
            iVar9 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                              (this,(ulong)(uint)u_local);
            if ((char)iVar9 == '\0') goto LAB_001a53b7;
            Tint::operator=(this->last_state_n + u_local,1);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->rem_node,&u_local);
            if (so.lazy == true) {
              expl = (Clause *)0x0;
              pLStack_60 = (Lit *)0x0;
              vec<Lit>::push((vec<Lit> *)&expl);
              LVar7 = BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)u_local);
              _last_seen = (Clause *)CONCAT44(uStack_7c,LVar7.x);
              vec<Lit>::push((vec<Lit> *)&expl,(Lit *)&last_seen);
              aVar10._pt = Reason_new<vec<Lit>>((vec<Lit> *)&expl);
              free(pLStack_60);
            }
            uVar8 = 0;
            while( true ) {
              pvVar1 = (this->ou).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar3 = *(long *)&pvVar1[u_local].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data;
              if ((ulong)((long)pvVar1[u_local].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - lVar3 >> 2) <=
                  (ulong)uVar8) break;
              oe = *(int *)(lVar3 + (ulong)uVar8 * 4);
              iVar9 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])(this);
              if ((char)iVar9 == '\0') goto LAB_001a53b7;
              pBVar4 = (this->super_GraphPropagator).es.data;
              pBVar11 = pBVar4 + (uint)oe;
              if (sat.assigns.data[(uint)pBVar4[(uint)oe].v] == '\0') {
                BoolView::setVal(pBVar11,false,(Reason)aVar10);
                Tint::operator=(this->last_state_e + oe,1);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&this->rem_edge,&oe);
              }
              else {
                bVar6 = BoolView::isTrue(pBVar11);
                if (bVar6) {
                  if (so.lazy == true) {
                    expl = (Clause *)0x0;
                    pLStack_60 = (Lit *)0x0;
                    LVar7 = BoolView::getValLit((this->super_GraphPropagator).vs.data +
                                                (uint)u_local);
                    pLVar14 = (Lit *)&last_seen;
                    _last_seen = (Clause *)CONCAT44(uStack_7c,LVar7.x);
                    vec<Lit>::push((vec<Lit> *)&expl,pLVar14);
                    _last_seen = Clause_new<vec<Lit>>((vec<Lit> *)&expl,SUB81(pLVar14,0));
                    *(byte *)_last_seen = *(byte *)_last_seen | 2;
                    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&last_seen)
                    ;
                    sat.confl = _last_seen;
                    free(pLStack_60);
                  }
                  goto LAB_001a53b7;
                }
              }
              uVar8 = uVar8 + 1;
            }
          }
        }
        else {
          bVar5 = BoolView::isTrue(pBVar11 + uVar12);
          if (!bVar5) {
            uVar12 = (ulong)(uint)u_local;
            pBVar11 = (this->super_GraphPropagator).vs.data;
            goto LAB_001a4f32;
          }
          if (so.lazy == true) {
            LVar7 = BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)u_local);
            expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
            vec<Lit>::push(&local_78,(Lit *)&expl);
            LVar7 = BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)this->root);
            pLVar14 = (Lit *)&expl;
            expl = (Clause *)CONCAT44(expl._4_4_,LVar7.x);
            vec<Lit>::push(&local_78,pLVar14);
            expl = Clause_new<vec<Lit>>(&local_78,SUB81(pLVar14,0));
            *(byte *)expl = *(byte *)expl | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
            sat.confl = expl;
          }
LAB_001a53b7:
          bVar5 = false;
          uVar13 = 0;
        }
      }
      else {
        uVar13 = 1;
        bVar5 = false;
      }
      free(local_78.data);
      free(local_48.data);
      if (!bVar5) goto LAB_001a53d8;
    }
  }
  uVar13 = 1;
LAB_001a53d8:
  return (bool)((byte)uVar13 & 1);
}

Assistant:

bool DReachabilityPropagator::remove_deg1(int u) {
	if (DEBUG) {
		std::cout << "Remove deg1 from " << u << '\n';
	}
	if (getNodeVar(u).isFixed() && getNodeVar(u).isFalse()) {
		return true;
	}

	if (u == get_root_idx() && in_nodes_size > 1) {
		Clause* r = nullptr;
		int out_deg = 0;
		int last_seen = -1;
		vec<Lit> ps_out;
		if (so.lazy) {
			ps_out.push();
		}
		for (const int oe : ou[get_root_idx()]) {
			if (!getEdgeVar(oe).isFixed() || getEdgeVar(oe).isTrue()) {
				out_deg++;
				last_seen = oe;
			} else if (so.lazy) {
				ps_out.push(getEdgeVar(oe).getValLit());
			}
		}
		if (out_deg == 1 && in_nodes_size > 1 && !getEdgeVar(last_seen).isFixed()) {
			if (so.lazy) {
				const int other = get_some_innode_not(u);
				assert(other != -1);
				ps_out.push(getNodeVar(get_root_idx()).getValLit());
				ps_out.push(getNodeVar(other).getValLit());
				r = Reason_new(ps_out);
			}
			getEdgeVar(last_seen).setVal(true, r);
			if (!propagateNewEdge(last_seen)) {
				return false;
			}
			last_state_e[last_seen] = VT_IN;
			new_edge.insert(last_seen);
			if (DEBUG) {
				std::cout << "Edge in " << last_seen << '\n';
			}
			// Propagate New Edge already does this.
			// We enforce the other extremity if not there yet:
			//*
			if (!getNodeVar(getHead(last_seen)).isFixed()) {
				if (so.lazy) {
					vec<Lit> ps;
					ps.push();
					ps.push(getEdgeVar(last_seen).getValLit());
					r = Reason_new(ps);
				}
				getNodeVar(getHead(last_seen)).setVal(true, r);
				last_state_n[getHead(last_seen)] = VT_IN;
				add_innode(getHead(last_seen));
				new_node.insert(getHead(last_seen));
				if (DEBUG) {
					std::cout << "Node in " << getHead(last_seen) << '\n';
				}
			} else if (getNodeVar(getHead(last_seen)).isFalse()) {
				if (so.lazy) {
					vec<Lit> psfail;
					psfail.push(getEdgeVar(last_seen).getValLit());
					Clause* expl = Clause_new(psfail);
					expl->temp_expl = 1;
					sat.rtrail.last().push(expl);
					sat.confl = expl;
				}
				if (DEBUG) {
					std::cout << "False " << __FILE__ << __LINE__ << '\n';
				}
				return false;
			}  //*/

			return true;
		}
	}

	if (u != get_root_idx()) {
		int in_deg = 0;
		vec<Lit> ps_in;
		vec<Lit> ps_in_fail;
		if (so.lazy) {
			ps_in.push();
		}

		for (const int ie : in[u]) {
			if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
				in_deg++;
			} else if (so.lazy) {
				ps_in.push(getEdgeVar(ie).getValLit());
				ps_in_fail.push(getEdgeVar(ie).getValLit());
			}
		}

		if (in_deg > 0) {
			return true;
		}

		if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
			// Fail because no way to get to this node
			if (so.lazy) {
				ps_in_fail.push(getNodeVar(u).getValLit());
				ps_in_fail.push(getNodeVar(get_root_idx()).getValLit());
				Clause* expl = Clause_new(ps_in_fail);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			if (DEBUG) {
				std::cout << "False " << u << " " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		Clause* r = nullptr;
		if (!getNodeVar(u).isFixed()) {
			// Force the node to be out.
			if (so.lazy) {
				ps_in.push(getNodeVar(get_root_idx()).getValLit());
				r = Reason_new(ps_in);
			}
			getNodeVar(u).setVal(false, r);
			if (!propagateRemNode(u)) {
				return false;
			}
			last_state_n[u] = VT_OUT;
			rem_node.insert(u);
			if (DEBUG) {
				std::cout << "Node out " << u << '\n';
			}
			//*
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(u).getValLit());
				r = Reason_new(ps);
			}  //*/
			for (unsigned int i = 0; i < ou[u].size(); i++) {
				const int oe = ou[u][i];
				if (!remove_deg1(getHead(oe))) {
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}
				// Done by PropagateRemNode
				//*
				if (!getEdgeVar(oe).isFixed()) {
					getEdgeVar(oe).setVal(false, r);
					last_state_e[oe] = VT_OUT;
					rem_edge.insert(oe);
					if (DEBUG) {
						std::cout << "Edge out " << oe << '\n';
					}

				} else if (getEdgeVar(oe).isTrue()) {
					if (so.lazy) {
						vec<Lit> psfail;
						psfail.push(getNodeVar(u).getValLit());
						Clause* expl = Clause_new(psfail);
						expl->temp_expl = 1;
						sat.rtrail.last().push(expl);
						sat.confl = expl;
					}
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}  //*/
			}
		}
	}

	return true;
}